

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O1

bool __thiscall wasm::anon_unknown_0::SubTyper::isSubType(SubTyper *this,HeapType a,HeapType b)

{
  BasicHeapType BVar1;
  uint uVar2;
  SubTyper *pSVar3;
  uint uVar4;
  bool bVar5;
  byte bVar6;
  HeapType local_20;
  HeapType a_local;
  HeapType b_local;
  
  if (this == (SubTyper *)a.id) goto LAB_00cc13ac;
  if (this < (SubTyper *)0x7d) {
    uVar4 = (uint)(((ulong)this & 4) == 0);
  }
  else {
    uVar4 = *(uint *)(this + 4);
  }
  if (a.id < 0x7d) {
    uVar2 = (uint)((a.id & 4) == 0);
  }
  else {
    uVar2 = *(uint *)(a.id + 4);
  }
  if ((uVar2 == 0) != (uVar4 == 0)) {
    bVar6 = 0;
    goto LAB_00cc1507;
  }
  local_20.id = (uintptr_t)this;
  a_local.id = a.id;
  if (0x7c < a.id) goto LAB_00cc14f0;
  BVar1 = HeapType::getUnsharedTop(&local_20);
  pSVar3 = (SubTyper *)(ulong)((uint)this & 0x7b);
  if ((SubTyper *)0x7c < this) {
    pSVar3 = this;
  }
  if (0x7c < a_local.id) {
    __assert_fail("isBasic()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0xe2,"BasicHeapType wasm::HeapType::getBasic(Shareability) const");
  }
  uVar4 = (uint)a_local.id & 0x7b;
  switch(uVar4 << 0x1d | uVar4 - 8 >> 3) {
  case 0:
    bVar5 = BVar1 == ext;
    break;
  case 1:
    bVar5 = BVar1 == func;
    break;
  case 2:
    bVar5 = BVar1 == cont;
    break;
  case 3:
    bVar5 = BVar1 == any;
    break;
  case 4:
    if (5 < ((long)pSVar3 << 0x3d | (ulong)(pSVar3 + -0x30) >> 3)) {
      if ((SubTyper *)0x7c < this) {
LAB_00cc14d1:
        BVar1 = (BasicHeapType)(*(int *)(this + 0x30) == 2);
        if ((SubTyper *)0x7c < this && *(int *)(this + 0x30) != 2) goto LAB_00cc14e3;
        goto LAB_00cc14ea;
      }
      goto switchD_00cc1440_caseD_a;
    }
    bVar6 = 0x27 >> ((byte)((ulong)(pSVar3 + -0x30) >> 3) & 0x1f);
    BVar1 = (BasicHeapType)bVar6;
    bVar5 = false;
    if (((SubTyper *)0x7c < this) && ((bVar6 & 1) == 0)) goto LAB_00cc14d1;
    goto LAB_00cc14ec;
  case 5:
    bVar5 = pSVar3 == (SubTyper *)&DAT_00000058;
    break;
  case 6:
    BVar1 = (BasicHeapType)(pSVar3 == (SubTyper *)&DAT_00000058);
    if ((SubTyper *)0x7c < this && pSVar3 != (SubTyper *)&DAT_00000058) {
      bVar5 = *(int *)(this + 0x30) == 2;
      break;
    }
    goto LAB_00cc14ea;
  case 7:
    BVar1 = (BasicHeapType)(pSVar3 == (SubTyper *)&DAT_00000058);
    if (this < (SubTyper *)0x7d || pSVar3 == (SubTyper *)&DAT_00000058) goto LAB_00cc14ea;
LAB_00cc14e3:
    bVar5 = *(int *)(this + 0x30) == 3;
    break;
  case 8:
    bVar5 = BVar1 == exn;
    break;
  case 9:
    bVar5 = pSVar3 == (SubTyper *)0x60;
    break;
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
switchD_00cc1440_caseD_a:
    bVar5 = false;
    BVar1 = 0;
    goto LAB_00cc14ec;
  default:
    bVar5 = true;
    goto LAB_00cc14ec;
  }
  BVar1 = (BasicHeapType)bVar5;
LAB_00cc14ea:
  bVar5 = false;
LAB_00cc14ec:
  bVar6 = (byte)BVar1;
  if (bVar5) {
LAB_00cc14f0:
    if (this < (SubTyper *)0x7d) {
      BVar1 = HeapType::getBottom(&a_local);
      bVar6 = (SubTyper *)(ulong)BVar1 == this;
    }
    else {
      do {
        this = *(SubTyper **)(this + 8);
        bVar6 = this != (SubTyper *)0x0;
        if (this == (SubTyper *)0x0) goto LAB_00cc1507;
        if (a_local.id < 0x7d) {
          __assert_fail("!ht.isBasic()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                        ,0xe6,"HeapTypeInfo *wasm::(anonymous namespace)::getHeapTypeInfo(HeapType)"
                       );
        }
      } while (this != (SubTyper *)a_local.id);
LAB_00cc13ac:
      bVar6 = 1;
    }
  }
LAB_00cc1507:
  return (bool)(bVar6 & 1);
}

Assistant:

bool SubTyper::isSubType(HeapType a, HeapType b) {
  // See:
  // https://github.com/WebAssembly/function-references/blob/master/proposals/function-references/Overview.md#subtyping
  // https://github.com/WebAssembly/gc/blob/master/proposals/gc/MVP.md#defined-types
  if (a == b) {
    return true;
  }
  if (a.isShared() != b.isShared()) {
    return false;
  }
  if (b.isBasic()) {
    auto aTop = a.getUnsharedTop();
    auto aUnshared = a.isBasic() ? a.getBasic(Unshared) : a;
    switch (b.getBasic(Unshared)) {
      case HeapType::ext:
        return aTop == HeapType::ext;
      case HeapType::func:
        return aTop == HeapType::func;
      case HeapType::cont:
        return aTop == HeapType::cont;
      case HeapType::exn:
        return aTop == HeapType::exn;
      case HeapType::any:
        return aTop == HeapType::any;
      case HeapType::eq:
        return aUnshared == HeapType::i31 || aUnshared == HeapType::none ||
               aUnshared == HeapType::struct_ || aUnshared == HeapType::array ||
               a.isStruct() || a.isArray();
      case HeapType::i31:
        return aUnshared == HeapType::none;
      case HeapType::string:
        return aUnshared == HeapType::noext;
      case HeapType::struct_:
        return aUnshared == HeapType::none || a.isStruct();
      case HeapType::array:
        return aUnshared == HeapType::none || a.isArray();
      case HeapType::none:
      case HeapType::noext:
      case HeapType::nofunc:
      case HeapType::nocont:
      case HeapType::noexn:
        return false;
    }
  }
  if (a.isBasic()) {
    // Basic HeapTypes are only subtypes of compound HeapTypes if they are
    // bottom types.
    return a == b.getBottom();
  }
  // Subtyping must be declared rather than derived from structure, so we will
  // not recurse. TODO: optimize this search with some form of caching.
  HeapTypeInfo* curr = getHeapTypeInfo(a);
  while ((curr = curr->supertype)) {
    if (curr == getHeapTypeInfo(b)) {
      return true;
    }
  }
  return false;
}